

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

void cfd::core::TaprootUtil::ParseTaprootSignData
               (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *witness_stack,
               SchnorrSignature *schnorr_signature,bool *has_parity,uint8_t *tapleaf_bit,
               SchnorrPubkey *internal_pubkey,
               vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *nodes,
               Script *tapscript,
               vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *stack,
               ByteData *annex)

{
  pointer pBVar1;
  bool bVar2;
  uint8_t uVar3;
  byte bVar4;
  const_reference pvVar5;
  size_t sVar6;
  CfdException *pCVar7;
  ulong uVar8;
  size_t index;
  ulong uVar9;
  size_type __n;
  ulong local_110;
  Deserializer parser;
  ByteData256 node;
  ByteData data;
  ByteData256 pubkey_bytes;
  size_t max_node;
  Script script;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  pBVar1 = (witness_stack->
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_110 = ((long)pBVar1 -
              (long)(witness_stack->
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                    _M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (((1 < local_110) && (bVar2 = ByteData::IsEmpty(pBVar1 + -1), !bVar2)) &&
     (uVar3 = ByteData::GetHeadData
                        ((witness_stack->
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         )._M_impl.super__Vector_impl_data._M_finish + -1), uVar3 == 'P')) {
    if (annex != (ByteData *)0x0) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&annex->data_,
                 &(witness_stack->
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                  _M_impl.super__Vector_impl_data._M_finish[-1].data_);
    }
    local_110 = local_110 - 1;
  }
  if (local_110 == 1) {
    if (schnorr_signature != (SchnorrSignature *)0x0) {
      pvVar5 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::at
                         (witness_stack,0);
      SchnorrSignature::SchnorrSignature((SchnorrSignature *)&script,pvVar5);
      SchnorrSignature::operator=(schnorr_signature,(SchnorrSignature *)&script);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script);
    }
    return;
  }
  if (local_110 == 0) {
    script._vptr_Script = (_func_int **)0x4b4a5c;
    script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x280;
    script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "ParseTaprootSignData";
    logger::warn<>((CfdSourceLocation *)&script,"witness_stack is empty.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&script,"witness_stack is empty.",(allocator *)&parser)
    ;
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&script);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pvVar5 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::at
                     (witness_stack,local_110 - 2);
  Script::Script(&script,pvVar5);
  pvVar5 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::at
                     (witness_stack,local_110 - 1);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&data.data_,&pvVar5->data_);
  sVar6 = ByteData::GetDataSize(&data);
  if ((0x20 < sVar6) && (sVar6 = ByteData::GetDataSize(&data), ((int)sVar6 - 1U & 0x1f) == 0)) {
    sVar6 = ByteData::GetDataSize(&data);
    uVar8 = sVar6 - 0x21 >> 5;
    max_node = uVar8;
    if (sVar6 - 0x21 < 0x1020) {
      Deserializer::Deserializer(&parser,&data);
      bVar4 = Deserializer::ReadUint8(&parser);
      if (has_parity != (bool *)0x0) {
        *has_parity = (bool)(bVar4 & 1);
      }
      if (tapleaf_bit != (uint8_t *)0x0) {
        *tapleaf_bit = bVar4 & 0xfe;
      }
      Deserializer::ReadBuffer(&node.data_,&parser,0x20);
      ByteData256::ByteData256(&pubkey_bytes,&node.data_);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&node);
      if (internal_pubkey != (SchnorrPubkey *)0x0) {
        SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&node,&pubkey_bytes);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)internal_pubkey,
                   (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&node);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&node);
      }
      if (nodes != (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)0x0) {
        for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 1) {
          Deserializer::ReadBuffer
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,&parser,0x20
                    );
          ByteData256::ByteData256
                    (&node,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_48);
          ::std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
          emplace_back<cfd::core::ByteData256&>
                    ((vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)nodes,
                     &node);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&node);
        }
      }
      if (tapscript != (Script *)0x0) {
        Script::operator=(tapscript,&script);
      }
      if ((stack != (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)0x0) &&
         (2 < local_110)) {
        for (__n = 0; local_110 - 2 != __n; __n = __n + 1) {
          pvVar5 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::at
                             (witness_stack,__n);
          ::std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
          emplace_back<cfd::core::ByteData_const&>
                    ((vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *)stack,pvVar5
                    );
        }
      }
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_bytes);
      Deserializer::~Deserializer(&parser);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
      Script::~Script(&script);
      return;
    }
    parser._vptr_Deserializer = (_func_int **)0x4b4a5c;
    parser.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x294;
    parser.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "ParseTaprootSignData";
    logger::warn<unsigned_long&>
              ((CfdSourceLocation *)&parser,"taproot control node maximum over. [{}]",&max_node);
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&parser,"taproot control node maximum over.",(allocator *)&pubkey_bytes);
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&parser);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  parser._vptr_Deserializer = (_func_int **)0x4b4a5c;
  parser.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x28c;
  parser.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "ParseTaprootSignData";
  logger::warn<>((CfdSourceLocation *)&parser,"wrong taproot control size.");
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&parser,"wrong taproot control size.",(allocator *)&pubkey_bytes);
  CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&parser);
  __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void TaprootUtil::ParseTaprootSignData(
    const std::vector<ByteData>& witness_stack,
    SchnorrSignature* schnorr_signature, bool* has_parity,
    uint8_t* tapleaf_bit, SchnorrPubkey* internal_pubkey,
    std::vector<ByteData256>* nodes, Script* tapscript,
    std::vector<ByteData>* stack, ByteData* annex) {
  static constexpr size_t kControlMinimumSize =
      SchnorrPubkey::kSchnorrPubkeySize + 1;

  size_t size = witness_stack.size();
  if ((size >= 2) && (!witness_stack.back().IsEmpty()) &&
      (witness_stack.back().GetHeadData() == TaprootUtil::kAnnexTag)) {
    if (annex != nullptr) *annex = witness_stack.back();
    --size;
  }

  if (size == 0) {
    warn(CFD_LOG_SOURCE, "witness_stack is empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "witness_stack is empty.");
  } else if (size == 1) {
    if (schnorr_signature != nullptr) {
      *schnorr_signature = SchnorrSignature(witness_stack.at(0));
    }
  } else {
    Script script(witness_stack.at(size - 2));
    ByteData data = witness_stack.at(size - 1);
    if ((data.GetDataSize() < kControlMinimumSize) ||
        (((data.GetDataSize() - 1) % kByteData256Length) != 0)) {
      warn(CFD_LOG_SOURCE, "wrong taproot control size.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "wrong taproot control size.");
    }
    size_t max_node =
        (data.GetDataSize() - kControlMinimumSize) / kByteData256Length;
    if (max_node > TaprootScriptTree::kTaprootControlMaxNodeCount) {
      warn(
          CFD_LOG_SOURCE, "taproot control node maximum over. [{}]", max_node);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "taproot control node maximum over.");
    }

    Deserializer parser(data);
    uint8_t top = parser.ReadUint8();
    if (has_parity != nullptr) *has_parity = (top & 0x01);
    if (tapleaf_bit != nullptr) *tapleaf_bit = top & 0xfe;

    ByteData256 pubkey_bytes(parser.ReadBuffer(kByteData256Length));
    if (internal_pubkey != nullptr) {
      *internal_pubkey = SchnorrPubkey(pubkey_bytes);
    }
    if (nodes != nullptr) {
      for (size_t index = 0; index < max_node; ++index) {
        ByteData256 node(parser.ReadBuffer(kByteData256Length));
        nodes->emplace_back(node);
      }
    }

    if (tapscript != nullptr) *tapscript = script;
    if ((stack != nullptr) && (size > 2)) {
      for (size_t index = 0; index < size - 2; ++index) {
        stack->emplace_back(witness_stack.at(index));
      }
    }
  }
}